

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_mol_extrap_vel_to_faces_box.cpp
# Opt level: O0

pair<bool,_bool> anon_unknown.dwarf_7ad5f1::has_extdir_or_ho(BCRec *bcrec,int ncomp,int dir)

{
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int n;
  pair<bool,_bool> r;
  bool local_5a;
  bool local_59;
  int local_58;
  bool local_52;
  bool local_51;
  int local_50;
  int local_4c;
  long local_48;
  pair<bool,_bool> local_3e [31];
  
  local_51 = false;
  local_52 = false;
  local_50 = in_EDX;
  local_4c = in_ESI;
  local_48 = in_RDI;
  std::pair<bool,_bool>::pair<bool,_bool,_true>(local_3e,&local_51,&local_52);
  for (local_58 = 0; local_58 < local_4c; local_58 = local_58 + 1) {
    local_59 = true;
    if (((ushort)local_3e[0] & 1) == 0) {
      local_59 = true;
      if (*(int *)(local_48 + (long)local_58 * 0x18 + (long)local_50 * 4) != 3) {
        local_59 = *(int *)(local_48 + (long)local_58 * 0x18 + (long)local_50 * 4) == 4;
      }
    }
    local_5a = true;
    if (((ushort)local_3e[0] >> 8 & 1) == 0) {
      local_5a = true;
      if (*(int *)(local_48 + (long)local_58 * 0x18 + (long)(local_50 + 3) * 4) != 3) {
        local_5a = *(int *)(local_48 + (long)local_58 * 0x18 + (long)(local_50 + 3) * 4) == 4;
      }
    }
    local_3e[0].second = local_5a;
    local_3e[0].first = local_59;
  }
  return local_3e[0];
}

Assistant:

std::pair<bool,bool> has_extdir_or_ho (BCRec const* bcrec, int ncomp, int dir)
    {
        std::pair<bool,bool> r{false,false};
        for (int n = 0; n < ncomp; ++n) {
            r.first = r.first
                 || (bcrec[n].lo(dir) == BCType::ext_dir)
                 || (bcrec[n].lo(dir) == BCType::hoextrap);
            r.second = r.second
                 || (bcrec[n].hi(dir) == BCType::ext_dir)
                 || (bcrec[n].hi(dir) == BCType::hoextrap);
        }
        return r;
    }